

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  pointer puVar1;
  pointer puVar2;
  void *pvVar3;
  uint32_t uVar4;
  uint8_t uVar5;
  undefined3 uVar6;
  uint32_t uVar7;
  NetType NVar8;
  undefined1 local_c8 [40];
  pointer local_a0;
  pointer puStack_98;
  pointer local_90;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  pointer local_70;
  pointer puStack_68;
  pointer local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  ExtPubkey *local_40;
  Privkey *local_38;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ext_privkey);
  uVar4 = ext_privkey->fingerprint_;
  uVar5 = ext_privkey->depth_;
  uVar6 = *(undefined3 *)&ext_privkey->field_0x21;
  uVar7 = ext_privkey->child_num_;
  (this->extprivkey_).version_ = ext_privkey->version_;
  (this->extprivkey_).fingerprint_ = uVar4;
  (this->extprivkey_).depth_ = uVar5;
  *(undefined3 *)&(this->extprivkey_).field_0x21 = uVar6;
  (this->extprivkey_).child_num_ = uVar7;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).chaincode_.data_,&(ext_privkey->chaincode_).data_);
  local_38 = &ext_privkey->privkey_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extprivkey_).privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  uVar6 = *(undefined3 *)&(ext_privkey->privkey_).field_0x19;
  NVar8 = (ext_privkey->privkey_).net_type_;
  (this->extprivkey_).privkey_.is_compressed_ = (ext_privkey->privkey_).is_compressed_;
  *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19 = uVar6;
  (this->extprivkey_).privkey_.net_type_ = NVar8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).tweak_sum_.data_,&(ext_privkey->tweak_sum_).data_);
  local_40 = &this->extpubkey_;
  ExtPubkey::ExtPubkey(local_40);
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->fingerprint_).data_,&finterprint->data_);
  if (child_path->_M_string_length != 0) {
    local_c8._0_8_ = local_c8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"KeyData","");
    ToArrayFromString(&local_58,child_path,(string *)local_c8,'\0');
    puVar1 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  ExtPrivkey::GetExtPubkey((ExtPubkey *)local_c8,ext_privkey);
  puVar2 = (this->extpubkey_).serialize_data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->extpubkey_).serialize_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_c8._0_8_;
  (this->extpubkey_).serialize_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_c8._8_8_;
  (this->extpubkey_).serialize_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_c8._16_8_;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  (this->extpubkey_).version_ = local_c8._24_4_;
  (this->extpubkey_).fingerprint_ = local_c8._28_4_;
  (this->extpubkey_).depth_ = local_c8[0x20];
  *(undefined3 *)&(this->extpubkey_).field_0x21 = local_c8._33_3_;
  (this->extpubkey_).child_num_ = local_c8._36_4_;
  puVar2 = (this->extpubkey_).chaincode_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->extpubkey_).chaincode_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_a0;
  (this->extpubkey_).chaincode_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_98;
  (this->extpubkey_).chaincode_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_90;
  local_a0 = (pointer)0x0;
  puStack_98 = (pointer)0x0;
  local_90 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->extpubkey_).pubkey_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88;
  *(pointer *)
   ((long)&(this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 8) = puStack_80;
  *(pointer *)
   ((long)&(this->extpubkey_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data + 0x10) = local_78;
  local_88 = (pointer)0x0;
  puStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->extpubkey_).tweak_sum_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->extpubkey_).tweak_sum_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_70;
  (this->extpubkey_).tweak_sum_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_68;
  (this->extpubkey_).tweak_sum_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_60;
  local_70 = (pointer)0x0;
  puStack_68 = (pointer)0x0;
  local_60 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_70 != (pointer)0x0) {
      operator_delete(local_70);
    }
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88);
  }
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0);
  }
  if ((pointer)local_c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._0_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  local_c8[0x18] = (ext_privkey->privkey_).is_compressed_;
  local_c8._25_3_ = *(undefined3 *)&(ext_privkey->privkey_).field_0x19;
  local_c8._28_4_ = (ext_privkey->privkey_).net_type_;
  puVar2 = (this->privkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
  (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
  (this->privkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  if (puVar2 == (pointer)0x0) {
    (this->privkey_).is_compressed_ = (bool)local_c8[0x18];
    *(undefined3 *)&(this->privkey_).field_0x19 = local_c8._25_3_;
    (this->privkey_).net_type_ = local_c8._28_4_;
  }
  else {
    operator_delete(puVar2);
    (this->privkey_).is_compressed_ = (bool)local_c8[0x18];
    *(undefined3 *)&(this->privkey_).field_0x19 = local_c8._25_3_;
    (this->privkey_).net_type_ = local_c8._28_4_;
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  Privkey::GetPubkey((Pubkey *)local_c8,&this->privkey_);
  pvVar3 = (this->pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_c8._8_8_;
  (this->pubkey_).data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = 0;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
    if ((pointer)local_c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_c8._0_8_);
    }
  }
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}